

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::class_<kratos::StatementType>::init_holder
               (instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  unique_ptr<kratos::StatementType,std::default_delete<kratos::StatementType>> *this;
  StatementType **ppSVar1;
  void *param_3_local;
  holder_type *holder_ptr_local;
  value_and_holder *v_h_local;
  instance *inst_local;
  
  if (holder_ptr == (holder_type *)0x0) {
    if ((inst->field_0x30 & 1) != 0) {
      this = (unique_ptr<kratos::StatementType,std::default_delete<kratos::StatementType>> *)
             pybind11::detail::value_and_holder::
             holder<std::unique_ptr<kratos::StatementType,std::default_delete<kratos::StatementType>>>
                       (v_h);
      ppSVar1 = pybind11::detail::value_and_holder::value_ptr<kratos::StatementType>(v_h);
      std::unique_ptr<kratos::StatementType,std::default_delete<kratos::StatementType>>::
      unique_ptr<std::default_delete<kratos::StatementType>,void>(this,*ppSVar1);
      pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
    }
  }
  else {
    init_holder_from_existing(v_h,holder_ptr);
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type *holder_ptr, const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }